

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSolve.c
# Opt level: O3

Vec_Int_t * Cec_ManSatSolveMiter(Gia_Man_t *pAig,Cec_ParSat_t *pPars,Vec_Str_t **pvStatus)

{
  size_t sVar1;
  undefined8 uVar2;
  int iVar3;
  Vec_Str_t *pVVar4;
  char *pcVar5;
  Vec_Int_t *vCexStore;
  int *piVar6;
  Cec_ManSat_t *p;
  Bar_Progress_t *p_00;
  Vec_Int_t *pVVar7;
  Gia_Obj_t *pGVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  timespec ts;
  int local_60;
  timespec local_50;
  size_t local_40;
  Bar_Progress_t *local_38;
  
  iVar3 = clock_gettime(3,&local_50);
  if (iVar3 < 0) {
    local_60 = 1;
  }
  else {
    local_60 = ((int)(SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_50.tv_nsec),8) >> 7) -
               (SUB164(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_50.tv_nsec),0xc) >> 0x1f)) +
               (int)local_50.tv_sec * -1000000;
  }
  Gia_ManSetPhase(pAig);
  Gia_ManLevelNum(pAig);
  Gia_ManIncrementTravId(pAig);
  iVar10 = pAig->vCos->nSize - pAig->nRegs;
  pVVar4 = (Vec_Str_t *)malloc(0x10);
  iVar3 = 0x10;
  if (0xe < iVar10 - 1U) {
    iVar3 = iVar10;
  }
  pVVar4->nSize = 0;
  pVVar4->nCap = iVar3;
  if (iVar3 == 0) {
    pcVar5 = (char *)0x0;
  }
  else {
    pcVar5 = (char *)malloc((long)iVar3);
  }
  pVVar4->pArray = pcVar5;
  vCexStore = (Vec_Int_t *)malloc(0x10);
  vCexStore->nCap = 10000;
  vCexStore->nSize = 0;
  piVar6 = (int *)malloc(40000);
  vCexStore->pArray = piVar6;
  p = Cec_ManSatCreate(pAig,pPars);
  p_00 = Bar_ProgressStart(_stdout,pAig->vCos->nSize - pAig->nRegs);
  pVVar7 = pAig->vCos;
  if (0 < pVVar7->nSize) {
    lVar11 = 0;
    local_38 = p_00;
    do {
      iVar3 = pVVar7->pArray[lVar11];
      if (((long)iVar3 < 0) || (pAig->nObjs <= iVar3)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar8 = pAig->pObjs;
      p_00 = local_38;
      if (pGVar8 == (Gia_Obj_t *)0x0) break;
      p->vCex->nSize = 0;
      iVar10 = (int)lVar11;
      if ((local_38 == (Bar_Progress_t *)0x0) || (local_38->nItemsNext <= lVar11)) {
        Bar_ProgressUpdate_int(local_38,iVar10,"SAT...");
      }
      pGVar8 = pGVar8 + iVar3;
      uVar9 = (uint)*(undefined8 *)pGVar8;
      if ((~*(ulong *)(pGVar8 + -(ulong)(uVar9 & 0x1fffffff)) & 0x1fffffff1fffffff) == 0) {
        if ((uVar9 >> 0x1d & 1) == 0) {
          uVar9 = pVVar4->nSize;
          if (uVar9 == pVVar4->nCap) {
            if ((int)uVar9 < 0x10) {
              if (pVVar4->pArray == (char *)0x0) {
                pcVar5 = (char *)malloc(0x10);
              }
              else {
                pcVar5 = (char *)realloc(pVVar4->pArray,0x10);
              }
              pVVar4->pArray = pcVar5;
              pVVar4->nCap = 0x10;
            }
            else {
              sVar1 = (ulong)uVar9 * 2;
              if (pVVar4->pArray == (char *)0x0) {
                pcVar5 = (char *)malloc(sVar1);
              }
              else {
                pcVar5 = (char *)realloc(pVVar4->pArray,sVar1);
              }
              pVVar4->pArray = pcVar5;
              pVVar4->nCap = (int)sVar1;
            }
          }
          else {
            pcVar5 = pVVar4->pArray;
          }
          pVVar4->nSize = uVar9 + 1;
          pcVar5[(int)uVar9] = '\x01';
        }
        else {
          Cec_ManSatAddToStore(vCexStore,p->vCex,iVar10);
          uVar9 = pVVar4->nSize;
          if (uVar9 == pVVar4->nCap) {
            if ((int)uVar9 < 0x10) {
              if (pVVar4->pArray == (char *)0x0) {
                pcVar5 = (char *)malloc(0x10);
              }
              else {
                pcVar5 = (char *)realloc(pVVar4->pArray,0x10);
              }
              pVVar4->pArray = pcVar5;
              pVVar4->nCap = 0x10;
            }
            else {
              sVar1 = (ulong)uVar9 * 2;
              if (pVVar4->pArray == (char *)0x0) {
                pcVar5 = (char *)malloc(sVar1);
              }
              else {
                pcVar5 = (char *)realloc(pVVar4->pArray,sVar1);
              }
              pVVar4->pArray = pcVar5;
              pVVar4->nCap = (int)sVar1;
            }
          }
          else {
            pcVar5 = pVVar4->pArray;
          }
          pVVar4->nSize = uVar9 + 1;
          pcVar5[(int)uVar9] = '\0';
        }
      }
      else {
        iVar3 = Cec_ManSatCheckNode(p,(Gia_Obj_t *)
                                      ((ulong)(uVar9 >> 0x1d & 1) ^
                                      (ulong)(pGVar8 + -(ulong)(uVar9 & 0x1fffffff))));
        uVar9 = pVVar4->nSize;
        if (uVar9 == pVVar4->nCap) {
          if ((int)uVar9 < 0x10) {
            if (pVVar4->pArray == (char *)0x0) {
              pcVar5 = (char *)malloc(0x10);
            }
            else {
              pcVar5 = (char *)realloc(pVVar4->pArray,0x10);
            }
            pVVar4->pArray = pcVar5;
            pVVar4->nCap = 0x10;
          }
          else {
            local_40 = (ulong)uVar9 * 2;
            if (pVVar4->pArray == (char *)0x0) {
              pcVar5 = (char *)malloc(local_40);
            }
            else {
              pcVar5 = (char *)realloc(pVVar4->pArray,local_40);
            }
            pVVar4->pArray = pcVar5;
            pVVar4->nCap = (int)local_40;
          }
        }
        else {
          pcVar5 = pVVar4->pArray;
        }
        pVVar4->nSize = uVar9 + 1;
        pcVar5[(int)uVar9] = (char)iVar3;
        if (iVar3 != 1) {
          if (iVar3 == -1) {
            Vec_IntPush(vCexStore,iVar10);
            Vec_IntPush(vCexStore,-1);
          }
          else {
            uVar2 = *(undefined8 *)pGVar8;
            p->vCex->nSize = 0;
            Gia_ManIncrementTravId(p->pAig);
            Cec_ManSatSolveMiter_rec
                      (p,p->pAig,
                       (Gia_Obj_t *)
                       ((ulong)(pGVar8 + -(ulong)((uint)uVar2 & 0x1fffffff)) & 0xfffffffffffffffe));
            Cec_ManSatAddToStore(vCexStore,p->vCex,iVar10);
          }
        }
      }
      lVar11 = lVar11 + 1;
      pVVar7 = pAig->vCos;
      p_00 = local_38;
    } while (lVar11 < pVVar7->nSize);
  }
  iVar3 = clock_gettime(3,&local_50);
  if (iVar3 < 0) {
    iVar3 = -1;
  }
  else {
    iVar3 = (int)(local_50.tv_nsec / 1000) + (int)local_50.tv_sec * 1000000;
  }
  p->timeTotal = iVar3 + local_60;
  Bar_ProgressStop(p_00);
  Cec_ManSatStop(p);
  *pvStatus = pVVar4;
  return vCexStore;
}

Assistant:

Vec_Int_t * Cec_ManSatSolveMiter( Gia_Man_t * pAig, Cec_ParSat_t * pPars, Vec_Str_t ** pvStatus )
{
    Bar_Progress_t * pProgress = NULL;
    Vec_Int_t * vCexStore;
    Vec_Str_t * vStatus;
    Cec_ManSat_t * p;
    Gia_Obj_t * pObj;
    int i, status;
    abctime clk = Abc_Clock();
    // prepare AIG
    Gia_ManSetPhase( pAig );
    Gia_ManLevelNum( pAig );
    Gia_ManIncrementTravId( pAig );
    // create resulting data-structures
    vStatus = Vec_StrAlloc( Gia_ManPoNum(pAig) );
    vCexStore = Vec_IntAlloc( 10000 );
    // perform solving
    p = Cec_ManSatCreate( pAig, pPars );
    pProgress = Bar_ProgressStart( stdout, Gia_ManPoNum(pAig) );
    Gia_ManForEachCo( pAig, pObj, i )
    {
        Vec_IntClear( p->vCex );
        Bar_ProgressUpdate( pProgress, i, "SAT..." );
        if ( Gia_ObjIsConst0(Gia_ObjFanin0(pObj)) )
        {
            if ( Gia_ObjFaninC0(pObj) )
            {
//                Abc_Print( 1, "Constant 1 output of SRM!!!\n" );
                Cec_ManSatAddToStore( vCexStore, p->vCex, i ); // trivial counter-example
                Vec_StrPush( vStatus, 0 );
            }
            else
            {
//                Abc_Print( 1, "Constant 0 output of SRM!!!\n" );
                Vec_StrPush( vStatus, 1 );
            }
            continue;
        }
        status = Cec_ManSatCheckNode( p, Gia_ObjChild0(pObj) );
        Vec_StrPush( vStatus, (char)status );
        if ( status == -1 )
        {
            Cec_ManSatAddToStore( vCexStore, NULL, i ); // timeout
            continue;
        }
        if ( status == 1 )
            continue;
        assert( status == 0 );
        // save the pattern
//        Gia_ManIncrementTravId( pAig );
//        Cec_ManSatSolveMiter_rec( p, pAig, Gia_ObjFanin0(pObj) );
        Cec_ManSavePattern( p, Gia_ObjFanin0(pObj), NULL );
//        Gia_SatVerifyPattern( pAig, pObj, p->vCex, p->vVisits );
        Cec_ManSatAddToStore( vCexStore, p->vCex, i );
    }
    p->timeTotal = Abc_Clock() - clk;
    Bar_ProgressStop( pProgress );
//    if ( pPars->fVerbose )
//        Cec_ManSatPrintStats( p );
    Cec_ManSatStop( p );
    *pvStatus = vStatus;
    return vCexStore;
}